

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_string_codePointAt(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  uint uVar2;
  JSValueUnion JVar3;
  JSValue JVar4;
  int64_t iStack_40;
  int idx;
  
  JVar4 = JS_ToStringCheckObject(ctx,this_val);
  if ((int)JVar4.tag == 6) {
    return JVar4;
  }
  iVar1 = JS_ToInt32Sat(ctx,&idx,*argv);
  if (iVar1 == 0) {
    iStack_40 = 3;
    if ((-1 < idx) && (iStack_40 = 3, (uint)idx < (*(uint *)((long)JVar4.u.ptr + 4) & 0x7fffffff)))
    {
      uVar2 = string_getc((JSString *)JVar4.u.ptr,&idx);
      JVar3._4_4_ = 0;
      JVar3.int32 = uVar2;
      iStack_40 = 0;
      goto LAB_00158143;
    }
  }
  else {
    iStack_40 = 6;
  }
  JVar3.float64 = 0.0;
LAB_00158143:
  JS_FreeValue(ctx,JVar4);
  JVar4.tag = iStack_40;
  JVar4.u.float64 = JVar3.float64;
  return JVar4;
}

Assistant:

static JSValue js_string_codePointAt(JSContext *ctx, JSValueConst this_val,
                                     int argc, JSValueConst *argv)
{
    JSValue val, ret;
    JSString *p;
    int idx, c;

    val = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(val))
        return val;
    p = JS_VALUE_GET_STRING(val);
    if (JS_ToInt32Sat(ctx, &idx, argv[0])) {
        JS_FreeValue(ctx, val);
        return JS_EXCEPTION;
    }
    if (idx < 0 || idx >= p->len) {
        ret = JS_UNDEFINED;
    } else {
        c = string_getc(p, &idx);
        ret = JS_NewInt32(ctx, c);
    }
    JS_FreeValue(ctx, val);
    return ret;
}